

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O1

MultiFab * __thiscall
amrex::cast<amrex::MultiFab,amrex::iMultiFab>
          (MultiFab *__return_storage_ptr__,amrex *this,iMultiFab *mf_in)

{
  int iVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  pointer *ppbVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  MFIter mfi;
  Box local_b8;
  undefined1 local_98 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  int local_70;
  Vector<int,_std::allocator<int>_> *local_60;
  Vector<int,_std::allocator<int>_> *local_58;
  FabFactory<amrex::FArrayBox> local_38;
  
  local_b8.smallend.vect._0_8_ = *(undefined8 *)(this + 0xc0);
  local_b8.smallend.vect[2] = *(int *)(this + 200);
  local_98._1_7_ = 0;
  local_98[0] = true;
  local_98._8_8_ = (FabArrayBase *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_38._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
  MultiFab::MultiFab(__return_storage_ptr__,(BoxArray *)(this + 8),
                     (DistributionMapping *)(this + 0x70),*(int *)(this + 0xcc),&local_b8.smallend,
                     (MFInfo *)local_98,&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  MFIter::MFIter((MFIter *)local_98,(FabArrayBase *)this,'\0');
  if ((int)local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_70) {
    do {
      FabArrayBase::fabbox
                (&local_b8,(FabArrayBase *)local_98._8_8_,
                 (local_60->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(int)local_88.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage]);
      ppbVar4 = &local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_58 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar4 = (pointer *)
                  ((local_58->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start +
                  (int)local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      iVar11 = local_b8.bigend.vect[0] - local_b8.smallend.vect[0];
      iVar7 = local_b8.bigend.vect[1] - local_b8.smallend.vect[1];
      iVar9 = local_b8.bigend.vect[2] - local_b8.smallend.vect[2];
      iVar1 = *(int *)(this + 0xcc);
      pdVar3 = BaseFab<double>::dataPtr
                         (&(__return_storage_ptr__->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                           super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar4]->
                           super_BaseFab<double>,0);
      ppbVar4 = &local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_58 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar4 = (pointer *)
                  ((local_58->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start +
                  (int)local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      lVar12 = (long)(iVar11 + 1);
      lVar8 = (long)(iVar7 + 1);
      lVar10 = (long)(iVar9 + 1);
      piVar5 = BaseFab<int>::dataPtr
                         (*(BaseFab<int> **)(*(long *)(this + 0x108) + (long)*(int *)ppbVar4 * 8),0)
      ;
      auVar2 = _DAT_0077bb40;
      if (0 < lVar10 * iVar1 * lVar8 * lVar12) {
        lVar10 = lVar12 * lVar10 * iVar1 * lVar8;
        lVar8 = lVar10 + -1;
        auVar13._8_4_ = (int)lVar8;
        auVar13._0_8_ = lVar8;
        auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar13 = auVar13 ^ _DAT_0077bb40;
        uVar6 = 0;
        auVar14 = _DAT_0077bb30;
        do {
          auVar15 = auVar14 ^ auVar2;
          if ((bool)(~(auVar13._4_4_ < auVar15._4_4_ ||
                      auVar13._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar13._4_4_) & 1)) {
            pdVar3[uVar6] = (double)piVar5[uVar6];
          }
          if (auVar15._12_4_ <= auVar13._12_4_ &&
              (auVar15._8_4_ <= auVar13._8_4_ || auVar15._12_4_ != auVar13._12_4_)) {
            pdVar3[uVar6 + 1] = (double)piVar5[uVar6 + 1];
          }
          uVar6 = uVar6 + 2;
          lVar8 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 2;
          auVar14._8_8_ = lVar8 + 2;
        } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar6);
      }
      MFIter::operator++((MFIter *)local_98);
    } while ((int)local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_70);
  }
  MFIter::~MFIter((MFIter *)local_98);
  return __return_storage_ptr__;
}

Assistant:

T cast (U const& mf_in)
    {
        T mf_out(mf_in.boxArray(), mf_in.DistributionMap(), mf_in.nComp(), mf_in.nGrowVect());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf_in); mfi.isValid(); ++mfi)
        {
            const Long n = mfi.fabbox().numPts() * mf_in.nComp();
            auto pdst = mf_out[mfi].dataPtr();
            auto psrc = mf_in [mfi].dataPtr();
            AMREX_HOST_DEVICE_PARALLEL_FOR_1D ( n, i,
            {
                pdst[i] = static_cast<typename U::value_type>(psrc[i]);
            });
        }
        return mf_out;
    }